

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

long proto2num(Configurable *config,long *val,char *str)

{
  byte bVar1;
  int iVar2;
  char *__s;
  ushort **ppuVar3;
  byte *pbVar4;
  sprotos *local_50;
  sprotos *pp;
  byte *pbStack_40;
  e_action action;
  char *token;
  char *sep;
  char *buffer;
  char *str_local;
  long *val_local;
  Configurable *config_local;
  
  if (str == (char *)0x0) {
    config_local = (Configurable *)0x1;
  }
  else {
    __s = strdup(str);
    if (__s == (char *)0x0) {
      config_local = (Configurable *)0x1;
    }
    else {
      pbStack_40 = (byte *)strtok(__s,",");
      while (pbStack_40 != (byte *)0x0) {
        pp._4_4_ = 0;
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)*pbStack_40] & 8) == 0) {
          pbVar4 = pbStack_40 + 1;
          bVar1 = *pbStack_40;
          pbStack_40 = pbVar4;
          if (bVar1 == 0x2b) {
            pp._4_4_ = 0;
          }
          else if (bVar1 == 0x2d) {
            pp._4_4_ = 1;
          }
          else {
            if (bVar1 != 0x3d) {
              if (__s != (char *)0x0) {
                free(__s);
              }
              return 1;
            }
            pp._4_4_ = 2;
          }
        }
        for (local_50 = proto2num::protos; local_50->name != (char *)0x0; local_50 = local_50 + 1) {
          iVar2 = Curl_raw_equal((char *)pbStack_40,local_50->name);
          if (iVar2 != 0) {
            if (pp._4_4_ == 0) {
              *val = local_50->bit | *val;
            }
            else if (pp._4_4_ == 1) {
              *val = (local_50->bit ^ 0xffffffffffffffffU) & *val;
            }
            else if (pp._4_4_ == 2) {
              *val = local_50->bit;
            }
            break;
          }
        }
        if (local_50->name == (char *)0x0) {
          if (pp._4_4_ == 2) {
            *val = 0;
          }
          warnf(config,"unrecognized protocol \'%s\'\n",pbStack_40);
        }
        pbStack_40 = (byte *)strtok((char *)0x0,",");
      }
      if (__s != (char *)0x0) {
        free(__s);
      }
      config_local = (Configurable *)0x0;
    }
  }
  return (long)config_local;
}

Assistant:

long proto2num(struct Configurable *config, long *val, const char *str)
{
  char *buffer;
  const char *sep = ",";
  char *token;

  static struct sprotos {
    const char *name;
    long bit;
  } const protos[] = {
    { "all", CURLPROTO_ALL },
    { "http", CURLPROTO_HTTP },
    { "https", CURLPROTO_HTTPS },
    { "ftp", CURLPROTO_FTP },
    { "ftps", CURLPROTO_FTPS },
    { "scp", CURLPROTO_SCP },
    { "sftp", CURLPROTO_SFTP },
    { "telnet", CURLPROTO_TELNET },
    { "ldap", CURLPROTO_LDAP },
    { "ldaps", CURLPROTO_LDAPS },
    { "dict", CURLPROTO_DICT },
    { "file", CURLPROTO_FILE },
    { "tftp", CURLPROTO_TFTP },
    { "imap", CURLPROTO_IMAP },
    { "imaps", CURLPROTO_IMAPS },
    { "pop3", CURLPROTO_POP3 },
    { "pop3s", CURLPROTO_POP3S },
    { "smtp", CURLPROTO_SMTP },
    { "smtps", CURLPROTO_SMTPS },
    { "rtsp", CURLPROTO_RTSP },
    { "gopher", CURLPROTO_GOPHER },
    { NULL, 0 }
  };

  if(!str)
    return 1;

  buffer = strdup(str); /* because strtok corrupts it */
  if(!buffer)
    return 1;

  for(token = strtok(buffer, sep);
      token;
      token = strtok(NULL, sep)) {
    enum e_action { allow, deny, set } action = allow;

    struct sprotos const *pp;

    /* Process token modifiers */
    while(!ISALNUM(*token)) { /* may be NULL if token is all modifiers */
      switch (*token++) {
      case '=':
        action = set;
        break;
      case '-':
        action = deny;
        break;
      case '+':
        action = allow;
        break;
      default: /* Includes case of terminating NULL */
        Curl_safefree(buffer);
        return 1;
      }
    }

    for(pp=protos; pp->name; pp++) {
      if(curlx_raw_equal(token, pp->name)) {
        switch (action) {
        case deny:
          *val &= ~(pp->bit);
          break;
        case allow:
          *val |= pp->bit;
          break;
        case set:
          *val = pp->bit;
          break;
        }
        break;
      }
    }

    if(!(pp->name)) { /* unknown protocol */
      /* If they have specified only this protocol, we say treat it as
         if no protocols are allowed */
      if(action == set)
        *val = 0;
      warnf(config, "unrecognized protocol '%s'\n", token);
    }
  }
  Curl_safefree(buffer);
  return 0;
}